

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsJava.cxx
# Opt level: O1

void __thiscall cmDependsJava::cmDependsJava(cmDependsJava *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38);
  cmDepends::cmDepends(&this->super_cmDepends,(cmLocalGenerator *)0x0,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->super_cmDepends)._vptr_cmDepends = (_func_int **)&PTR__cmDependsJava_0067b300;
  return;
}

Assistant:

cmDependsJava::cmDependsJava() = default;